

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Maybe<kj::CompressionParameters> *
kj::_::compareClientAndServerConfigs
          (Maybe<kj::CompressionParameters> *__return_storage_ptr__,
          CompressionParameters *requestConfig,CompressionParameters *manualConfig)

{
  bool bVar1;
  undefined2 uVar2;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 in_RCX;
  bool bVar3;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 in_R9;
  bool bVar4;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar5;
  
  bVar1 = (manualConfig->outboundMaxWindowBits).ptr.isSet;
  if (bVar1 == true) {
    in_R9 = (manualConfig->outboundMaxWindowBits).ptr.field_1;
  }
  uVar2._0_1_ = manualConfig->outboundNoContextTakeover;
  uVar2._1_1_ = manualConfig->inboundNoContextTakeover;
  bVar3 = (manualConfig->inboundMaxWindowBits).ptr.isSet;
  if (bVar3 == true) {
    in_RCX = (manualConfig->inboundMaxWindowBits).ptr.field_1;
  }
  if (((undefined1)uVar2 == '\0') && (requestConfig->outboundNoContextTakeover == true)) {
LAB_003ebc81:
    (__return_storage_ptr__->ptr).isSet = false;
    return __return_storage_ptr__;
  }
  if (((requestConfig->inboundMaxWindowBits).ptr.isSet & bVar3) == 1) {
    aVar5 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
            (requestConfig->inboundMaxWindowBits).ptr.field_1.value;
    bVar4 = bVar3;
    if (aVar5.value < (manualConfig->inboundMaxWindowBits).ptr.field_1.value) {
      in_RCX = aVar5;
      bVar4 = true;
    }
  }
  else {
    bVar4 = false;
    if (bVar3 == false) {
      bVar4 = bVar3;
    }
  }
  bVar3 = (requestConfig->outboundMaxWindowBits).ptr.isSet;
  if (bVar1 == false) {
    if (bVar3 != false) goto LAB_003ebc81;
    (__return_storage_ptr__->ptr).isSet = true;
    *(undefined2 *)&(__return_storage_ptr__->ptr).field_1 = uVar2;
    (__return_storage_ptr__->ptr).field_1.value.outboundMaxWindowBits.ptr.isSet = false;
    goto LAB_003ebc91;
  }
  if (bVar3 == false) {
LAB_003ebc65:
    aVar5 = in_R9;
    bVar3 = bVar1;
  }
  else {
    aVar5 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
            (requestConfig->outboundMaxWindowBits).ptr.field_1.value;
    bVar3 = true;
    if ((manualConfig->outboundMaxWindowBits).ptr.field_1.value <= aVar5.value) goto LAB_003ebc65;
  }
  (__return_storage_ptr__->ptr).isSet = true;
  *(undefined2 *)&(__return_storage_ptr__->ptr).field_1 = uVar2;
  (__return_storage_ptr__->ptr).field_1.value.outboundMaxWindowBits.ptr.isSet = bVar3;
  ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
  ((long)&(__return_storage_ptr__->ptr).field_1 + 0x10))->value = (unsigned_long)aVar5;
LAB_003ebc91:
  (__return_storage_ptr__->ptr).field_1.value.inboundMaxWindowBits.ptr.isSet = bVar4;
  if (bVar4 != false) {
    *(anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
     ((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) = in_RCX;
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<CompressionParameters> compareClientAndServerConfigs(CompressionParameters requestConfig,
    CompressionParameters manualConfig) {
  // We start from the `manualConfig` and go through a series of filters to get a compression
  // configuration that both the client and the server can agree upon. If no agreement can be made,
  // we return null.

  CompressionParameters acceptedParameters = manualConfig;

  // We only need to modify `client_no_context_takeover` and `server_no_context_takeover` when
  // `manualConfig` doesn't include them.
  if (manualConfig.inboundNoContextTakeover == false) {
    acceptedParameters.inboundNoContextTakeover = false;
  }

  if (manualConfig.outboundNoContextTakeover == false) {
    acceptedParameters.outboundNoContextTakeover = false;
    if (requestConfig.outboundNoContextTakeover == true) {
      // The client has told the server to not use context takeover. This is not a "hint",
      // rather it is a restriction on the server's configuration. If the server does not support
      // the configuration, it must reject the offer.
      return kj::none;
    }
  }

  // client_max_window_bits
  if (requestConfig.inboundMaxWindowBits != kj::none &&
      manualConfig.inboundMaxWindowBits != kj::none)  {
    // We want `min(requestConfig, manualConfig)` in this case.
    auto reqBits = KJ_ASSERT_NONNULL(requestConfig.inboundMaxWindowBits);
    auto manualBits = KJ_ASSERT_NONNULL(manualConfig.inboundMaxWindowBits);
    if (reqBits < manualBits) {
      acceptedParameters.inboundMaxWindowBits = reqBits;
    }
  } else {
    // We will not reply with `client_max_window_bits`.
    acceptedParameters.inboundMaxWindowBits = kj::none;
  }

  // server_max_window_bits
  if (manualConfig.outboundMaxWindowBits != kj::none) {
    auto manualBits = KJ_ASSERT_NONNULL(manualConfig.outboundMaxWindowBits);
    if (requestConfig.outboundMaxWindowBits != kj::none) {
      // We want `min(requestConfig, manualConfig)` in this case.
      auto reqBits = KJ_ASSERT_NONNULL(requestConfig.outboundMaxWindowBits);
      if (reqBits < manualBits) {
        acceptedParameters.outboundMaxWindowBits = reqBits;
      }
    }
  } else {
    acceptedParameters.outboundMaxWindowBits = kj::none;
    if (requestConfig.outboundMaxWindowBits != kj::none) {
      // The client has told the server to use `server_max_window_bits`. This is not a "hint",
      // rather it is a restriction on the server's configuration. If the server does not support
      // the configuration, it must reject the offer.
      return kj::none;
    }
  }
  return acceptedParameters;
}